

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Srm(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  char *pcVar6;
  uint fSpeculate;
  uint fDualOut;
  char pFileName [10];
  char pFileName2 [10];
  uint local_64;
  uint local_60;
  uint local_5c;
  char local_58 [16];
  char local_48 [16];
  Abc_Frame_t *local_38;
  
  builtin_strncpy(local_58,"gsrm.aig",9);
  pcVar5 = (char *)0x0;
  local_58[9] = '\0';
  builtin_strncpy(local_48,"gsyn.aig",9);
  local_48[9] = '\0';
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  fSpeculate = 1;
  local_64 = 0;
  local_60 = 0;
  local_5c = 0;
  fDualOut = 0;
  while( true ) {
    while( true ) {
      while (iVar2 = Extra_UtilGetopt(argc,argv,"Adrsfvh"), pAVar1 = local_38, iVar2 == 100) {
        fDualOut = fDualOut ^ 1;
      }
      if (iVar2 < 0x72) break;
      if (iVar2 == 0x72) {
        local_60 = local_60 ^ 1;
      }
      else if (iVar2 == 0x73) {
        fSpeculate = fSpeculate ^ 1;
      }
      else {
        if (iVar2 != 0x76) goto LAB_00224959;
        local_64 = local_64 ^ 1;
      }
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x41) {
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by a file name.\n");
LAB_00224959:
        Abc_Print(-2,"usage: &srm [-A file] [-drsfvh]\n");
        Abc_Print(-2,"\t          writes speculatively reduced model into file \"%s\"\n",local_58);
        Abc_Print(-2,
                  "\t-A file : file name for dumping speculative-reduced model [default = \"gsrm.aig\"]\n"
                 );
        pcVar6 = "yes";
        pcVar5 = "yes";
        if (fDualOut == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-d      : toggle creating dual-output miter [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (local_60 == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-r      : toggle writing reduced network for synthesis [default = %s]\n",
                  pcVar5);
        pcVar5 = "yes";
        if (fSpeculate == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-s      : toggle using speculation at the internal nodes [default = %s]\n",
                  pcVar5);
        pcVar5 = "yes";
        if (local_5c == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-f      : toggle filtering to remove redundant equivalences [default = %s]\n",
                  pcVar5);
        if (local_64 == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar6);
        pcVar5 = "\t-h      : print the command usage\n";
        iVar2 = -2;
LAB_00224a48:
        Abc_Print(iVar2,pcVar5);
        return 1;
      }
      pcVar5 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
    else {
      if (iVar2 != 0x66) goto LAB_00224959;
      local_5c = local_5c ^ 1;
    }
  }
  if (local_38->pGia != (Gia_Man_t *)0x0) {
    pcVar6 = "";
    if (fSpeculate == 0) {
      pcVar6 = "s";
    }
    sprintf(local_58,"gsrm%s.aig",pcVar6);
    sprintf(local_48,"gsyn%s.aig",pcVar6);
    pGVar3 = Gia_ManSpecReduce(pAVar1->pGia,fDualOut,local_60,fSpeculate,local_5c,local_64);
    if (pGVar3 != (Gia_Man_t *)0x0) {
      pGVar4 = pGVar3;
      if (fSpeculate != 0) {
        pGVar4 = Gia_ManSeqStructSweep(pGVar3,1,1,0);
        Gia_ManStop(pGVar3);
      }
      if (pcVar5 == (char *)0x0) {
        pcVar5 = local_58;
      }
      Gia_AigerWrite(pGVar4,pcVar5,0,0);
      Abc_Print(1,"Speculatively reduced model was written into file \"%s\".\n",local_58);
      Gia_ManPrintStatsShort(pGVar4);
      Gia_ManStop(pGVar4);
    }
    if (local_60 == 0) {
      return 0;
    }
    pGVar3 = Gia_ManEquivReduce(local_38->pGia,1,fDualOut,0,local_64);
    if (pGVar3 == (Gia_Man_t *)0x0) {
      return 0;
    }
    pGVar4 = Gia_ManSeqStructSweep(pGVar3,1,1,0);
    Gia_ManStop(pGVar3);
    Gia_AigerWrite(pGVar4,local_48,0,0);
    Abc_Print(1,"Reduced original network was written into file \"%s\".\n",local_48);
    Gia_ManPrintStatsShort(pGVar4);
    Gia_ManStop(pGVar4);
    return 0;
  }
  pcVar5 = "Abc_CommandAbc9Srm(): There is no AIG.\n";
  iVar2 = -1;
  goto LAB_00224a48;
}

Assistant:

int Abc_CommandAbc9Srm( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileNameIn = NULL;
    char pFileName[10] = "gsrm.aig", pFileName2[10] = "gsyn.aig";
    Gia_Man_t * pTemp, * pAux;
    int c, fVerbose = 0;
    int fSynthesis = 0;
    int fSpeculate = 1;
    int fSkipSome = 0;
    int fDualOut = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Adrsfvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileNameIn = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'd':
            fDualOut ^= 1;
            break;
        case 'r':
            fSynthesis ^= 1;
            break;
        case 's':
            fSpeculate ^= 1;
            break;
        case 'f':
            fSkipSome ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Srm(): There is no AIG.\n" );
        return 1;
    }
    sprintf(pFileName,  "gsrm%s.aig", fSpeculate? "" : "s" );
    sprintf(pFileName2, "gsyn%s.aig", fSpeculate? "" : "s" );
    pTemp = Gia_ManSpecReduce( pAbc->pGia, fDualOut, fSynthesis, fSpeculate, fSkipSome, fVerbose );
    if ( pTemp )
    {
        if ( fSpeculate )
        {
            pTemp = Gia_ManSeqStructSweep( pAux = pTemp, 1, 1, 0 );
            Gia_ManStop( pAux );
        }
        Gia_AigerWrite( pTemp, pFileNameIn ? pFileNameIn : pFileName, 0, 0 );
        Abc_Print( 1, "Speculatively reduced model was written into file \"%s\".\n", pFileName );
        Gia_ManPrintStatsShort( pTemp );
        Gia_ManStop( pTemp );
    }
    if ( fSynthesis )
    {
        pTemp = Gia_ManEquivReduce( pAbc->pGia, 1, fDualOut, 0, fVerbose );
        if ( pTemp )
        {
            pTemp = Gia_ManSeqStructSweep( pAux = pTemp, 1, 1, 0 );
            Gia_ManStop( pAux );

            Gia_AigerWrite( pTemp, pFileName2, 0, 0 );
            Abc_Print( 1, "Reduced original network was written into file \"%s\".\n", pFileName2 );
            Gia_ManPrintStatsShort( pTemp );
            Gia_ManStop( pTemp );
        }
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &srm [-A file] [-drsfvh]\n" );
    Abc_Print( -2, "\t          writes speculatively reduced model into file \"%s\"\n", pFileName );
    Abc_Print( -2, "\t-A file : file name for dumping speculative-reduced model [default = \"gsrm.aig\"]\n" );
    Abc_Print( -2, "\t-d      : toggle creating dual-output miter [default = %s]\n", fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-r      : toggle writing reduced network for synthesis [default = %s]\n", fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle using speculation at the internal nodes [default = %s]\n", fSpeculate? "yes": "no" );
    Abc_Print( -2, "\t-f      : toggle filtering to remove redundant equivalences [default = %s]\n", fSkipSome? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}